

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::verifyShader
               (NegativeTestContext *ctx,ShaderType shaderType,string *shaderSource)

{
  NegativeTestContext *this;
  bool bVar1;
  RenderContext *renderCtx;
  MessageBuilder *this_00;
  allocator<char> local_251;
  string local_250;
  MessageBuilder local_230;
  undefined1 local_a0 [8];
  Shader shader;
  char *pcStack_30;
  int length;
  char *source;
  TestLog *log;
  string *shaderSource_local;
  NegativeTestContext *pNStack_10;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  log = (TestLog *)shaderSource;
  shaderSource_local._4_4_ = shaderType;
  pNStack_10 = ctx;
  source = (char *)glu::CallLogWrapper::getLog(&ctx->super_CallLogWrapper);
  pcStack_30 = (char *)std::__cxx11::string::c_str();
  shader.m_info.compileTimeUs._4_4_ = std::__cxx11::string::size();
  renderCtx = NegativeTestContext::getRenderContext(pNStack_10);
  glu::Shader::Shader((Shader *)local_a0,renderCtx,shaderSource_local._4_4_);
  glu::Shader::setSources
            ((Shader *)local_a0,1,&stack0xffffffffffffffd0,
             (int *)((long)&shader.m_info.compileTimeUs + 4));
  glu::Shader::compile((Shader *)local_a0);
  glu::operator<<((TestLog *)source,(Shader *)local_a0);
  bVar1 = glu::Shader::getCompileStatus((Shader *)local_a0);
  if (bVar1) {
    tcu::TestLog::operator<<
              (&local_230,(TestLog *)source,(BeginMessageToken *)&tcu::TestLog::Message);
    this_00 = tcu::MessageBuilder::operator<<
                        (&local_230,
                         (char (*) [49])"Expected shader to fail, but compilation passed.");
    tcu::MessageBuilder::operator<<(this_00,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_230);
    this = pNStack_10;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_250,"Shader was not expected to compile.\n",&local_251);
    NegativeTestContext::fail(this,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::allocator<char>::~allocator(&local_251);
  }
  glu::Shader::~Shader((Shader *)local_a0);
  return;
}

Assistant:

void verifyShader (NegativeTestContext& ctx, glu::ShaderType shaderType, std::string shaderSource)
{
	tcu::TestLog&	log		= ctx.getLog();
	const char*		source	= shaderSource.c_str();
	const int		length	= (int) shaderSource.size();
	glu::Shader		shader	(ctx.getRenderContext(), shaderType);

	shader.setSources(1, &source, &length);
	shader.compile();

	log << shader;
	if (shader.getCompileStatus())
	{
		log << tcu::TestLog::Message << "Expected shader to fail, but compilation passed." << tcu::TestLog::EndMessage;
		ctx.fail("Shader was not expected to compile.\n");
	}
}